

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

uint16_t __thiscall icu_63::Normalizer2Impl::getFCD16FromNormData(Normalizer2Impl *this,UChar32 c)

{
  undefined2 uVar1;
  uint16_t uVar2;
  ushort uVar3;
  uint uVar4;
  ushort uVar5;
  
  uVar2 = getNorm16(this,c);
  uVar4 = (uint)uVar2;
  if (this->limitNoNo <= uVar2) {
    if (0xfbff < uVar4) {
      uVar5 = uVar2 >> 1 & 0xff;
      uVar3 = (uVar2 >> 1) << 8;
      goto LAB_002993df;
    }
    if (this->minMaybeYes <= uVar2) {
      return 0;
    }
    if ((ushort)(uVar4 & 6) < 3) {
      return (uint16_t)((uVar4 & 6) >> 1);
    }
    uVar2 = getRawNorm16(this,((uint)(uVar2 >> 3) + c) - (uint)this->centerNoNoDelta);
    uVar4 = (uint)uVar2;
  }
  if (((ushort)uVar4 <= this->minYesNo) ||
     (uVar1 = this->minYesNoMappingsOnly, (uVar1 | 1) == (ushort)uVar4)) {
    return 0;
  }
  uVar5 = *(ushort *)((long)this->extraData + (ulong)(uVar4 & 0xfffe));
  uVar3 = uVar5 >> 8;
  if (-1 < (char)uVar5) {
    return uVar3;
  }
  uVar5 = (ushort)*(byte *)((long)this->extraData + (ulong)(uVar4 >> 1) * 2 + -1) << 8;
LAB_002993df:
  return uVar3 | uVar5;
}

Assistant:

uint16_t Normalizer2Impl::getFCD16FromNormData(UChar32 c) const {
    uint16_t norm16=getNorm16(c);
    if (norm16 >= limitNoNo) {
        if(norm16>=MIN_NORMAL_MAYBE_YES) {
            // combining mark
            norm16=getCCFromNormalYesOrMaybe(norm16);
            return norm16|(norm16<<8);
        } else if(norm16>=minMaybeYes) {
            return 0;
        } else {  // isDecompNoAlgorithmic(norm16)
            uint16_t deltaTrailCC = norm16 & DELTA_TCCC_MASK;
            if (deltaTrailCC <= DELTA_TCCC_1) {
                return deltaTrailCC >> OFFSET_SHIFT;
            }
            // Maps to an isCompYesAndZeroCC.
            c=mapAlgorithmic(c, norm16);
            norm16=getRawNorm16(c);
        }
    }
    if(norm16<=minYesNo || isHangulLVT(norm16)) {
        // no decomposition or Hangul syllable, all zeros
        return 0;
    }
    // c decomposes, get everything from the variable-length extra data
    const uint16_t *mapping=getMapping(norm16);
    uint16_t firstUnit=*mapping;
    norm16=firstUnit>>8;  // tccc
    if(firstUnit&MAPPING_HAS_CCC_LCCC_WORD) {
        norm16|=*(mapping-1)&0xff00;  // lccc
    }
    return norm16;
}